

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_CertThenKeyMismatch_Test::TestBody
          (SSLTest_CertThenKeyMismatch_Test *this)

{
  int iVar1;
  SSL_METHOD *meth;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr_6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<X509> leaf;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<SSL_CTX> ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  _Head_base<0UL,_x509_st_*,_false> local_28;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_20;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_18;
  
  meth = (SSL_METHOD *)TLS_method();
  local_18._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  local_60._M_head_impl._0_1_ = local_18._M_head_impl != (SSL_CTX *)0x0;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)0x3442d9,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1312,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    goto LAB_001968fe;
  }
  KeyFromPEM((anon_unknown_0 *)&local_20,(anonymous_namespace)::GetTestKey()::kKeyPEM);
  local_60._M_head_impl._0_1_ = (EVP_PKEY *)local_20._M_head_impl != (EVP_PKEY *)0x0;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_20._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)0x3a8821,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1315,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  else {
    GetChainTestCertificate();
    local_60._M_head_impl._0_1_ = (X509 *)local_28._M_head_impl != (X509 *)0x0;
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((X509 *)local_28._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)&local_60,(AssertionResult *)"leaf","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1317,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
LAB_0019684e:
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58;
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
      }
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
      local_40 = local_58;
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_001968e5:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,local_40);
      }
    }
    else {
      iVar1 = SSL_CTX_check_private_key((SSL_CTX *)local_18._M_head_impl);
      local_60._M_head_impl._0_1_ = iVar1 == 0;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 != 0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,(internal *)&local_60,
                   (AssertionResult *)"SSL_CTX_check_private_key(ctx.get())","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x131a,(char *)CONCAT71(local_48._1_7_,local_48[0]));
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1
                         );
        }
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      iVar1 = SSL_CTX_use_certificate
                        ((SSL_CTX *)local_18._M_head_impl,(X509 *)local_28._M_head_impl);
      local_60._M_head_impl._0_1_ = iVar1 != 0;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,(internal *)&local_60,
                   (AssertionResult *)"SSL_CTX_use_certificate(ctx.get(), leaf.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x131d,(char *)CONCAT71(local_48._1_7_,local_48[0]));
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
        goto LAB_0019684e;
      }
      iVar1 = SSL_CTX_check_private_key((SSL_CTX *)local_18._M_head_impl);
      local_60._M_head_impl._0_1_ = iVar1 == 0;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 != 0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,(internal *)&local_60,
                   (AssertionResult *)"SSL_CTX_check_private_key(ctx.get())","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x131e,(char *)CONCAT71(local_48._1_7_,local_48[0]));
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1
                         );
        }
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      iVar1 = SSL_CTX_use_PrivateKey
                        ((SSL_CTX *)local_18._M_head_impl,(EVP_PKEY *)local_20._M_head_impl);
      local_60._M_head_impl._0_1_ = iVar1 == 0;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 != 0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,(internal *)&local_60,
                   (AssertionResult *)"SSL_CTX_use_PrivateKey(ctx.get(), key.get())","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1321,(char *)CONCAT71(local_48._1_7_,local_48[0]));
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1
                         );
        }
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      iVar1 = SSL_CTX_check_private_key((SSL_CTX *)local_18._M_head_impl);
      local_60._M_head_impl._0_1_ = iVar1 == 0;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 != 0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,(internal *)&local_60,
                   (AssertionResult *)"SSL_CTX_check_private_key(ctx.get())","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1325,(char *)CONCAT71(local_48._1_7_,local_48[0]));
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1
                         );
        }
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           SSL_CTX_get0_privatekey(local_18._M_head_impl);
      local_68._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperEQ<evp_pkey_st*,evp_pkey_st*>
                ((internal *)local_48,"nullptr","SSL_CTX_get0_privatekey(ctx.get())",
                 (evp_pkey_st **)&local_68,(evp_pkey_st **)&local_60);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1326,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
        if ((EVP_PKEY *)local_60._M_head_impl != (EVP_PKEY *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40;
        goto LAB_001968e5;
      }
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_28);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_20);
LAB_001968fe:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST(SSLTest, CertThenKeyMismatch) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  bssl::UniquePtr<EVP_PKEY> key = GetTestKey();
  ASSERT_TRUE(key);
  bssl::UniquePtr<X509> leaf = GetChainTestCertificate();
  ASSERT_TRUE(leaf);

  // There is no key or certificate, so |SSL_CTX_check_private_key| fails.
  EXPECT_FALSE(SSL_CTX_check_private_key(ctx.get()));

  // With only a certificate, |SSL_CTX_check_private_key| still fails.
  ASSERT_TRUE(SSL_CTX_use_certificate(ctx.get(), leaf.get()));
  EXPECT_FALSE(SSL_CTX_check_private_key(ctx.get()));

  // The private key does not match the certificate, so it should fail.
  EXPECT_FALSE(SSL_CTX_use_PrivateKey(ctx.get(), key.get()));

  // Checking the private key fails, but this is really because there is still
  // no private key.
  EXPECT_FALSE(SSL_CTX_check_private_key(ctx.get()));
  EXPECT_EQ(nullptr, SSL_CTX_get0_privatekey(ctx.get()));
}